

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int select_dispatch(event_base *base,timeval *tv)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  short events;
  uint uVar4;
  int fd;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  bool bVar10;
  
  piVar8 = (int *)base->evbase;
  if (piVar8[2] != 0) {
    iVar1 = piVar8[1];
    pvVar6 = event_mm_realloc_(*(void **)(piVar8 + 8),(long)iVar1);
    if (pvVar6 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar8 + 8) = pvVar6;
    pvVar6 = event_mm_realloc_(*(void **)(piVar8 + 10),(long)iVar1);
    if (pvVar6 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar8 + 10) = pvVar6;
    piVar8[2] = 0;
  }
  memcpy(*(void **)(piVar8 + 8),*(void **)(piVar8 + 4),(long)piVar8[1]);
  memcpy(*(void **)(piVar8 + 10),*(void **)(piVar8 + 6),(long)piVar8[1]);
  iVar1 = *piVar8;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar4 = select(iVar1 + 1,*(fd_set **)(piVar8 + 8),*(fd_set **)(piVar8 + 10),(fd_set *)0x0,
                 (timeval *)tv);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar4 == 0xffffffff) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      event_warn("select");
      return -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: select reports %d","select_dispatch",(ulong)uVar4);
    }
    fd = evutil_weakrand_range_(&base->weakrand_seed,iVar1 + 1);
    if (-1 < iVar1) {
      iVar9 = -1;
      do {
        bVar10 = iVar1 <= fd;
        fd = fd + 1;
        if (bVar10) {
          fd = 0;
        }
        iVar5 = fd + 0x3f;
        if (-1 < fd) {
          iVar5 = fd;
        }
        uVar7 = 1L << ((byte)fd & 0x3f);
        uVar2 = *(ulong *)(*(long *)(piVar8 + 8) + (long)(iVar5 >> 6) * 8);
        uVar3 = *(ulong *)(*(long *)(piVar8 + 10) + (long)(iVar5 >> 6) * 8);
        if ((uVar7 & (uVar3 | uVar2)) != 0) {
          bVar10 = (uVar2 & uVar7) != 0;
          events = bVar10 + 4 + (ushort)bVar10;
          if ((uVar3 & uVar7) == 0) {
            events = (ushort)bVar10 * 2;
          }
          evmap_io_active_(base,fd,events);
        }
        iVar9 = iVar9 + 1;
      } while (iVar1 != iVar9);
    }
  }
  return 0;
}

Assistant:

static int
select_dispatch(struct event_base *base, struct timeval *tv)
{
	int res=0, i, j, nfds;
	struct selectop *sop = base->evbase;

	check_selectop(sop);
	if (sop->resize_out_sets) {
		fd_set *readset_out=NULL, *writeset_out=NULL;
		size_t sz = sop->event_fdsz;
		if (!(readset_out = mm_realloc(sop->event_readset_out, sz)))
			return (-1);
		sop->event_readset_out = readset_out;
		if (!(writeset_out = mm_realloc(sop->event_writeset_out, sz))) {
			/* We don't free readset_out here, since it was
			 * already successfully reallocated. The next time
			 * we call select_dispatch, the realloc will be a
			 * no-op. */
			return (-1);
		}
		sop->event_writeset_out = writeset_out;
		sop->resize_out_sets = 0;
	}

	memcpy(sop->event_readset_out, sop->event_readset_in,
	       sop->event_fdsz);
	memcpy(sop->event_writeset_out, sop->event_writeset_in,
	       sop->event_fdsz);

	nfds = sop->event_fds+1;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = select(nfds, sop->event_readset_out,
	    sop->event_writeset_out, NULL, tv);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	check_selectop(sop);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("select");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: select reports %d", __func__, res));

	check_selectop(sop);
	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; ++j) {
		if (++i >= nfds)
			i = 0;
		res = 0;
		if (FD_ISSET(i, sop->event_readset_out))
			res |= EV_READ;
		if (FD_ISSET(i, sop->event_writeset_out))
			res |= EV_WRITE;

		if (res == 0)
			continue;

		evmap_io_active_(base, i, res);
	}
	check_selectop(sop);

	return (0);
}